

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O1

int AF_A_AlertMonsters(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AActor *pAVar3;
  byte bVar4;
  PClass *pPVar5;
  uint uVar6;
  undefined8 uVar7;
  PClass *pPVar8;
  undefined4 in_register_00000014;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 emitter;
  VMValue *pVVar9;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 target;
  char *__assertion;
  bool bVar10;
  double maxdist;
  undefined1 auVar11 [16];
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  uVar7 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005d09a3;
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_005d0978:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_005d09a3:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0x95,"int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  emitter = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)(param->field_0).field_1.a;
  pVVar9 = param;
  if (emitter != (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0) {
    if (*(PClass **)((long)emitter + 8) == (PClass *)0x0) {
      auVar11 = (*(code *)**(undefined8 **)emitter)(emitter.p);
      uVar7 = auVar11._8_8_;
      *(PClass **)((long)emitter + 8) = auVar11._0_8_;
    }
    pPVar8 = *(PClass **)((long)emitter + 8);
    bVar10 = pPVar8 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar10;
    uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),bVar10);
    pVVar9 = (VMValue *)(ulong)(pPVar8 == pPVar5 || bVar10);
    if (pPVar8 != pPVar5 && !bVar10) {
      do {
        pPVar8 = pPVar8->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
        if (pPVar8 == pPVar5) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005d09a3;
    }
  }
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
    if ((VVar1 != '\x03') ||
       ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
    goto LAB_005d0978;
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        uVar7 = (**(code **)*puVar2)(puVar2,pVVar9,uVar7,ret);
        puVar2[1] = uVar7;
      }
      pPVar8 = (PClass *)puVar2[1];
      bVar10 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar5 && bVar10) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar10 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar5) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (!bVar10) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005d09a3;
      }
    }
  }
  if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
     ((VVar1 != '\x03' ||
      ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
    goto LAB_005d09a3;
  }
  maxdist = 0.0;
  if (3 < numparam) {
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\x01') {
      maxdist = param[3].field_0.f;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                    ,0x96,"int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  uVar6 = 0;
  if (4 < numparam) {
    VVar1 = param[4].field_0.field_3.Type;
    if (VVar1 == '\0') {
      uVar6 = param[4].field_0.i;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                    ,0x97,"int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  target = emitter;
  if ((uVar6 & 1) != 0 || *(player_t **)((long)emitter + 0x200) != (player_t *)0x0)
  goto LAB_005d0953;
  pAVar3 = (((TObjPtr<AActor> *)((long)emitter + 0x1d8))->field_0).p;
  bVar4 = 1;
  if (pAVar3 != (AActor *)0x0) {
    if ((*(byte *)((long)&(pAVar3->super_DThinker).super_DObject + 0x20) & 0x20) == 0) {
      bVar4 = 0;
    }
    else {
      (((TObjPtr<AActor> *)((long)emitter + 0x1d8))->field_0).p = (AActor *)0x0;
    }
  }
  target = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
           (((TObjPtr<AActor> *)((long)(emitter.o + 0xb) + 0x20))->field_0).p;
  if ((bool)((uVar6 & 2) == 0 | bVar4)) {
    if (target.p != (AActor *)0x0) {
      if ((((target.p)->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) goto LAB_005d0946;
      if ((((emitter.p)->target).field_0.p)->player != (player_t *)0x0) {
        target = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
                 (((TObjPtr<AActor> *)((long)(emitter.o + 0xb) + 0x20))->field_0).p;
        goto LAB_005d093b;
      }
    }
  }
  else {
LAB_005d093b:
    if ((target.p == (AActor *)0x0) ||
       ((((target.p)->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)) goto LAB_005d0953;
LAB_005d0946:
    ((emitter.p)->target).field_0.p = (AActor *)0x0;
  }
  target.p = (AActor *)0x0;
LAB_005d0953:
  if ((uVar6 & 4) != 0) {
    emitter = target;
  }
  if ((target.p != (AActor *)0x0) && (emitter != (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0)
     ) {
    P_NoiseAlert(target.p,(AActor *)emitter,false,maxdist);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_AlertMonsters)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_FLOAT_OPT(maxdist) { maxdist = 0; }
	PARAM_INT_OPT(Flags) { Flags = 0; }

	AActor * target = NULL;
	AActor * emitter = self;

	if (self->player != NULL || (Flags & AMF_TARGETEMITTER))
	{
		target = self;
	}
	else if (self->target != NULL && (Flags & AMF_TARGETNONPLAYER))
	{
		target = self->target;
	}
	else if (self->target != NULL && self->target->player != NULL)
	{
		target = self->target;
	}

	if (Flags & AMF_EMITFROMTARGET) emitter = target;

	if (target != NULL && emitter != NULL)
	{
		P_NoiseAlert(target, emitter, false, maxdist);
	}
	return 0;
}